

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O3

istream * operator>>(istream *is,Graph<Node> *g)

{
  NodeList<Node> *this;
  int iVar1;
  Edge *__size;
  Node *pNVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  istream *piVar7;
  NodeList<Node> *pNVar8;
  size_t __size_00;
  int iVar9;
  int cost;
  int y;
  int x;
  int inputEdgeCnt;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  istream *local_40;
  vector<Edge> *local_38;
  
  local_40 = is;
  piVar7 = (istream *)std::istream::operator>>((istream *)is,&g->_nodeCnt);
  std::istream::operator>>(piVar7,&local_44);
  Graph<Node>::resize(g,g->_nodeCnt);
  if (0 < local_44) {
    local_38 = &g->edges;
    iVar9 = 0;
    do {
      piVar7 = (istream *)std::istream::operator>>((istream *)local_40,&local_48);
      piVar7 = (istream *)std::istream::operator>>(piVar7,&local_4c);
      std::istream::operator>>(piVar7,&local_50);
      iVar5 = local_48;
      iVar4 = local_4c;
      iVar3 = local_50;
      g->_edgeCnt = g->_edgeCnt + 1;
      iVar6 = (g->edges)._size;
      iVar1 = (g->edges)._capacity;
      if (iVar1 <= iVar6) {
        vector<Edge>::realloc(local_38,(void *)(ulong)(uint)(iVar1 * 2),__size_00);
        iVar6 = (g->edges)._size;
      }
      (g->edges)._size = iVar6 + 1;
      __size = (g->edges).vect;
      __size[iVar6]._nodeS = iVar5;
      __size[iVar6]._nodeD = iVar4;
      __size[iVar6]._cost = iVar3;
      pNVar8 = (g->G).vect;
      this = pNVar8 + iVar5;
      iVar6 = (this->nodes)._size;
      iVar1 = (this->nodes)._capacity;
      if (iVar1 <= iVar6) {
        vector<Node>::realloc(&this->nodes,(void *)(ulong)(uint)(iVar1 * 2),(size_t)__size);
        iVar6 = (this->nodes)._size;
        pNVar8 = (g->G).vect;
      }
      (this->nodes)._size = iVar6 + 1;
      pNVar2 = (this->nodes).vect;
      pNVar2[iVar6]._index = iVar4;
      pNVar2[iVar6]._costTo = iVar3;
      pNVar8 = pNVar8 + iVar4;
      iVar6 = (pNVar8->nodes)._size;
      iVar1 = (pNVar8->nodes)._capacity;
      if (iVar1 <= iVar6) {
        vector<Node>::realloc(&pNVar8->nodes,(void *)(ulong)(uint)(iVar1 * 2),(long)iVar4);
        iVar6 = (pNVar8->nodes)._size;
      }
      (pNVar8->nodes)._size = iVar6 + 1;
      pNVar2 = (pNVar8->nodes).vect;
      pNVar2[iVar6]._index = iVar5;
      pNVar2[iVar6]._costTo = iVar3;
      iVar9 = iVar9 + 1;
    } while (iVar9 < local_44);
  }
  return local_40;
}

Assistant:

std::istream &operator >> (std::istream &is, Graph <NodeT> &g) {
        int inputEdgeCnt;
        is >> g._nodeCnt >> inputEdgeCnt;
        g.resize(g._nodeCnt);
        for (int i = 0; i < inputEdgeCnt; ++i) {
            int x, y, cost;
            is >> x >> y >> cost;
            g.addEdge(Edge(x, y, cost));
        }
        return is;
    }